

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

Vec_Ptr_t *
Aig_ManPartSplit(Aig_Man_t *p,Vec_Int_t *vNode2Part,Vec_Ptr_t **pvPio2Id,Vec_Ptr_t **pvPart2Pos)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Vec_t *pVVar3;
  Aig_Obj_t *Entry;
  void *pvVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *Entry_00;
  uint uVar7;
  uint i;
  ulong uVar8;
  Vec_Int_t *vPio2IdOne;
  
  p_00 = Vec_PtrAlloc(100);
  p_01 = Vec_PtrAlloc(100);
  iVar1 = Vec_IntFindMax(vNode2Part);
  if (-1 < iVar1) {
    pVVar3 = Vec_VecAlloc(iVar1 + 1);
    for (iVar1 = 0; iVar1 < vNode2Part->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vNode2Part,iVar1);
      Entry = Aig_ManObj(p,iVar1);
      if (0xfffffffd < (*(uint *)&Entry->field_0x18 & 7) - 7) {
        Vec_VecPush(pVVar3,iVar2,Entry);
      }
    }
    for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(p->vCos,iVar1);
      uVar5 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
      uVar8 = *(ulong *)(uVar5 + 0x18);
      if (((uint)uVar8 & 7) == 2) {
        *(ulong *)(uVar5 + 0x18) =
             uVar8 | (ulong)((*(ulong *)((long)pvVar4 + 8) & 1) == 0) * 0x10 + 0x10;
      }
    }
    uVar7 = pVVar3->nSize;
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    for (i = 0; uVar7 != i; i = i + 1) {
      pVVar6 = Vec_VecEntry(pVVar3,i);
      if (pVVar6->nSize == 0) {
        printf("Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n",(ulong)i);
      }
      else {
        Entry_00 = Aig_ManPartSplitOne(p,pVVar6,&vPio2IdOne);
        Vec_PtrPush(p_01,vPio2IdOne);
        Vec_PtrPush(p_00,Entry_00);
      }
    }
    Vec_VecFree(pVVar3);
    uVar7 = p_00->nSize;
    pVVar3 = Vec_VecAlloc(uVar7);
    uVar5 = 0;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      pVVar6 = Vec_PtrAlloc(0);
      pVVar3->pArray[uVar5] = pVVar6;
    }
    pVVar3->nSize = uVar7;
    for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(p->vCos,iVar1);
      uVar8 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
      if (((uint)*(ulong *)(uVar8 + 0x18) & 7) == 2) {
        *(ulong *)(uVar8 + 0x18) = *(ulong *)(uVar8 + 0x18) & 0xffffffffffffffca;
      }
      else {
        iVar2 = -1;
        if (*(ulong *)((long)pvVar4 + 8) != 0) {
          iVar2 = *(int *)(uVar8 + 0x24);
        }
        iVar2 = Vec_IntEntry(vNode2Part,iVar2);
        Vec_VecPush(pVVar3,iVar2,pvVar4);
      }
    }
    *pvPio2Id = p_01;
    *pvPart2Pos = (Vec_Ptr_t *)pVVar3;
    return p_00;
  }
  __assert_fail("nParts > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPartSat.c"
                ,0xed,
                "Vec_Ptr_t *Aig_ManPartSplit(Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t **, Vec_Ptr_t **)")
  ;
}

Assistant:

Vec_Ptr_t * Aig_ManPartSplit( Aig_Man_t * p, Vec_Int_t * vNode2Part, Vec_Ptr_t ** pvPio2Id, Vec_Ptr_t ** pvPart2Pos )
{
    Vec_Vec_t * vGroups, * vPart2Pos;
    Vec_Ptr_t * vAigs, * vPio2Id, * vNodes;
    Vec_Int_t * vPio2IdOne;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObj, * pDriver;
    int i, nodePart, nParts;
    vAigs = Vec_PtrAlloc( 100 );
    vPio2Id = Vec_PtrAlloc( 100 );
    // put all nodes into levels according to their partition
    nParts = Vec_IntFindMax(vNode2Part) + 1;
    assert( nParts > 0 );
    vGroups = Vec_VecAlloc( nParts );
    Vec_IntForEachEntry( vNode2Part, nodePart, i )
    {
        pObj = Aig_ManObj( p, i );
        if ( Aig_ObjIsNode(pObj) )
            Vec_VecPush( vGroups, nodePart, pObj );
    }

    // label PIs that should be restricted to some values
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                pDriver->fMarkA = 1; // const0 PI
            else
                pDriver->fMarkB = 1; // const1 PI
        }
    }

    // create partitions
    Vec_VecForEachLevel( vGroups, vNodes, i )
    {
        if ( Vec_PtrSize(vNodes) == 0 )
        {
            printf( "Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n", i );
            continue;
        }
        pAig = Aig_ManPartSplitOne( p, vNodes, &vPio2IdOne );
        Vec_PtrPush( vPio2Id, vPio2IdOne );
        Vec_PtrPush( vAigs, pAig );
    }
    Vec_VecFree( vGroups );

    // divide POs according to their partitions
    vPart2Pos = Vec_VecStart( Vec_PtrSize(vAigs) );
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
            pDriver->fMarkA = pDriver->fMarkB = 0;
        else
            Vec_VecPush( vPart2Pos, Vec_IntEntry(vNode2Part, Aig_ObjFaninId0(pObj)), pObj );
    }

    *pvPio2Id = vPio2Id;
    *pvPart2Pos = (Vec_Ptr_t *)vPart2Pos;
    return vAigs;
}